

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O1

Var __thiscall
InlineeFrameRecord::Restore
          (InlineeFrameRecord *this,int offset,bool isFloat64,bool isInt32,
          JavascriptCallStackLayout *layout,FunctionBody *functionBody,bool boxValue)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  uint uVar4;
  undefined4 *puVar5;
  uint64 uVar6;
  uint64 uVar7;
  ScriptContext *scriptContext;
  int32 int32Value;
  Var instance;
  Var pvVar8;
  double value;
  
  if (offset < 0) {
    if (DAT_015d346a == '\x01') {
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
      if ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar2) goto LAB_00562236;
        *puVar5 = 0;
      }
      bVar2 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015cd718,BailOutPhase,uVar4,
                         ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                          functionInfo.ptr)->functionId);
      if (bVar2) {
        Output::Print(L"Stack offset %10d",(ulong)(uint)offset);
      }
    }
    if (isFloat64) {
      value = Js::JavascriptCallStackLayout::GetDoubleAtOffset(layout,offset);
      Js::FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
      uVar6 = Js::NumberUtilities::ToSpecial(value);
      bVar2 = Js::NumberUtilities::IsNan(value);
      if (((bVar2) && (uVar7 = Js::NumberUtilities::ToSpecial(value), uVar7 != 0xfff8000000000000))
         && (uVar7 = Js::NumberUtilities::ToSpecial(value), uVar7 != 0x7ff8000000000000)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Library/JavascriptNumber.inl"
                           ,0xa2,
                           "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                           ,"We should only produce a NaN with this value");
        if (!bVar2) goto LAB_00562236;
        *puVar5 = 0;
      }
      instance = (Var)(uVar6 ^ 0xfffc000000000000);
      if (DAT_015d346a == '\x01') {
        uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
        if ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
            (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar2) goto LAB_00562236;
          *puVar5 = 0;
        }
        bVar2 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015cd718,BailOutPhase,uVar4,
                           ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                            functionInfo.ptr)->functionId);
        if (bVar2) {
          Output::Print(L", value: %f (ToVar: 0x%p)",value,instance);
        }
      }
    }
    else if (isInt32) {
      iVar3 = Js::JavascriptCallStackLayout::GetInt32AtOffset(layout,offset);
      instance = (Var)(long)iVar3;
    }
    else {
      instance = Js::JavascriptCallStackLayout::GetOffset(layout,offset);
    }
  }
  else {
    if (this->constantCount <= (uint)offset) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                         ,0x14a,"(static_cast<uint>(offset) < constantCount)",
                         "static_cast<uint>(offset) < constantCount");
      if (!bVar2) goto LAB_00562236;
      *puVar5 = 0;
    }
    instance = this->constants[(uint)offset];
    boxValue = false;
  }
  if (isInt32) {
    Js::FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
    pvVar8 = (Var)((ulong)instance & 0xffffffff | 0x1000000000000);
    if (DAT_015d346a == '\x01') {
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
      if ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar2) goto LAB_00562236;
        *puVar5 = 0;
      }
      bVar2 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015cd718,BailOutPhase,uVar4,
                         ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                          functionInfo.ptr)->functionId);
      if (bVar2) {
        Output::Print(L", value: %10d (ToVar: 0x%p)",(ulong)instance & 0xffffffff,pvVar8);
      }
    }
  }
  else {
    if (DAT_015d346a == '\x01') {
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
      if ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar2) goto LAB_00562236;
        *puVar5 = 0;
      }
      bVar2 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015cd718,BailOutPhase,uVar4,
                         ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                          functionInfo.ptr)->functionId);
      if (bVar2) {
        Output::Print(L", value: 0x%p",instance);
      }
    }
    pvVar8 = instance;
    if (boxValue != false) {
      scriptContext = Js::FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
      pvVar8 = Js::JavascriptOperators::BoxStackInstance(instance,scriptContext,true,false);
      if ((instance != pvVar8) && (DAT_015d346a == '\x01')) {
        uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
        if ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
            (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar2) goto LAB_00562236;
          *puVar5 = 0;
        }
        bVar2 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015cd718,BailOutPhase,uVar4,
                           ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                            functionInfo.ptr)->functionId);
        if (bVar2) {
          Output::Print(L" (Boxed: 0x%p)",pvVar8);
        }
      }
    }
  }
  if (DAT_015d346a == '\x01') {
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    if ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) {
LAB_00562236:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015cd718,BailOutPhase,uVar4,
                       ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo
                       .ptr)->functionId);
    if (bVar2) {
      Output::Print(L"\n");
    }
  }
  return pvVar8;
}

Assistant:

Js::Var InlineeFrameRecord::Restore(int offset, bool isFloat64, bool isInt32, Js::JavascriptCallStackLayout * layout, Js::FunctionBody* functionBody, bool boxValue) const
{
    Js::Var value;
    bool boxStackInstance = boxValue;
    double dblValue;
    if (offset >= 0)
    {
        Assert(static_cast<uint>(offset) < constantCount);
        value = this->constants[offset];
        boxStackInstance = false;
    }
    else
    {
        BAILOUT_VERBOSE_TRACE(functionBody, _u("Stack offset %10d"), offset);
        if (isFloat64)
        {
            dblValue = layout->GetDoubleAtOffset(offset);
            value = Js::JavascriptNumber::New(dblValue, functionBody->GetScriptContext());
            BAILOUT_VERBOSE_TRACE(functionBody, _u(", value: %f (ToVar: 0x%p)"), dblValue, value);
        }
        else if (isInt32)
        {
            value = (Js::Var)layout->GetInt32AtOffset(offset);
        }
        else
        {
            value = layout->GetOffset(offset);
        }
    }

    if (isInt32)
    {
        int32 int32Value = ::Math::PointerCastToIntegralTruncate<int32>(value);
        value = Js::JavascriptNumber::ToVar(int32Value, functionBody->GetScriptContext());
        BAILOUT_VERBOSE_TRACE(functionBody, _u(", value: %10d (ToVar: 0x%p)"), int32Value, value);
    }
    else
    {
        BAILOUT_VERBOSE_TRACE(functionBody, _u(", value: 0x%p"), value);
        if (boxStackInstance)
        {
            // Do not deepCopy in this call to BoxStackInstance because this should be used for
            // bailing out, where a shallow copy that is cached is needed to ensure that multiple
            // vars pointing to the same boxed object reuse the new boxed value.
            Js::Var oldValue = value;
            value = Js::JavascriptOperators::BoxStackInstance(oldValue, functionBody->GetScriptContext(), /* allowStackFunction */ true, false /* deepCopy */);

#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (oldValue != value)
            {
                BAILOUT_VERBOSE_TRACE(functionBody, _u(" (Boxed: 0x%p)"), value);
            }
#endif
        }
    }
    BAILOUT_VERBOSE_TRACE(functionBody, _u("\n"));
    return value;
}